

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

double google::protobuf::internal::NoLocaleStrtod(char *str,char **endptr)

{
  int iVar1;
  size_t sVar2;
  long *in_RSI;
  char *in_RDI;
  int size_diff;
  char *localized_endptr;
  char *localized_cstr;
  string localized;
  double result;
  char *temp_endptr;
  char *in_stack_000000c0;
  char *in_stack_000000c8;
  char *local_58;
  char *local_50;
  string local_48 [32];
  double local_28;
  char *local_20;
  long *local_18;
  char *local_10;
  double local_8;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_28 = strtod(in_RDI,&local_20);
  if (local_18 != (long *)0x0) {
    *local_18 = (long)local_20;
  }
  local_8 = local_28;
  if (*local_20 == '.') {
    (anonymous_namespace)::LocalizeRadix_abi_cxx11_(in_stack_000000c8,in_stack_000000c0);
    local_50 = (char *)std::__cxx11::string::c_str();
    local_28 = strtod(local_50,&local_58);
    if (((long)local_20 - (long)local_10 < (long)local_58 - (long)local_50) &&
       (local_18 != (long *)0x0)) {
      iVar1 = std::__cxx11::string::size();
      sVar2 = strlen(local_10);
      *local_18 = (long)(local_10 +
                        (long)(local_58 + (-(long)(iVar1 - (int)sVar2) - (long)local_50)));
    }
    local_8 = local_28;
    std::__cxx11::string::~string(local_48);
  }
  return local_8;
}

Assistant:

double NoLocaleStrtod(const char *str, char **endptr) {
  // We cannot simply set the locale to "C" temporarily with setlocale()
  // as this is not thread-safe.  Instead, we try to parse in the current
  // locale first.  If parsing stops at a '.' character, then this is a
  // pretty good hint that we're actually in some other locale in which
  // '.' is not the radix character.

  char *temp_endptr;
  double result = strtod(str, &temp_endptr);
  if (endptr != NULL) *endptr = temp_endptr;
  if (*temp_endptr != '.') return result;

  // Parsing halted on a '.'.  Perhaps we're in a different locale?  Let's
  // try to replace the '.' with a locale-specific radix character and
  // try again.
  std::string localized = LocalizeRadix(str, temp_endptr);
  const char *localized_cstr = localized.c_str();
  char *localized_endptr;
  result = strtod(localized_cstr, &localized_endptr);
  if ((localized_endptr - localized_cstr) > (temp_endptr - str)) {
    // This attempt got further, so replacing the decimal must have helped.
    // Update endptr to point at the right location.
    if (endptr != NULL) {
      // size_diff is non-zero if the localized radix has multiple bytes.
      int size_diff = localized.size() - strlen(str);
      // const_cast is necessary to match the strtod() interface.
      *endptr = const_cast<char *>(
          str + (localized_endptr - localized_cstr - size_diff));
    }
  }

  return result;
}